

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testMinMaxEigenValueImp<double>(void)

{
  Matrix33<double> *in_stack_00000030;
  Matrix44<double> *in_stack_00000160;
  Matrix44<double> local_190;
  Matrix44<double> local_110;
  Matrix33<double> local_90;
  Matrix33<double> local_48;
  
  Imath_3_2::Matrix33<double>::Matrix33(&local_48,&A33_7);
  testMinMaxEigenValue<Imath_3_2::Matrix33<double>>(in_stack_00000030);
  Imath_3_2::Matrix33<double>::Matrix33(&local_90,&A33_8);
  testMinMaxEigenValue<Imath_3_2::Matrix33<double>>(in_stack_00000030);
  Imath_3_2::Matrix44<double>::Matrix44(&local_110,&A44_7);
  testMinMaxEigenValue<Imath_3_2::Matrix44<double>>(in_stack_00000160);
  Imath_3_2::Matrix44<double>::Matrix44(&local_190,&A44_8);
  testMinMaxEigenValue<Imath_3_2::Matrix44<double>>(in_stack_00000160);
  return;
}

Assistant:

void
testMinMaxEigenValueImp ()
{
    testMinMaxEigenValue (Matrix33<T> (A33_7));
    testMinMaxEigenValue (Matrix33<T> (A33_8));

    testMinMaxEigenValue (Matrix44<T> (A44_7));
    testMinMaxEigenValue (Matrix44<T> (A44_8));
}